

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O3

void lj_symtab_dump(lj_wbuf *out,global_State *g,uint32_t *lib_adds)

{
  uint uVar1;
  GCproto *pt;
  GCtrace *trace;
  symbol_resolver_conf conf;
  lj_wbuf *local_38;
  ulong local_30;
  undefined1 local_28;
  undefined8 local_24;
  uint32_t *local_18;
  
  local_30 = (ulong)(g->cur_L).gcptr32;
  local_28 = 1;
  local_24 = 0;
  local_38 = out;
  local_18 = lib_adds;
  lj_wbuf_addn(out,"ljs\x03",7);
  uVar1 = (g->gc).root.gcptr32;
  while (uVar1 != 0) {
    trace = (GCtrace *)(ulong)uVar1;
    if (trace->gct == '\t') {
      lj_wbuf_addbyte(out,'\x02');
      lj_symtab_dump_trace(out,trace);
    }
    else if (trace->gct == '\a') {
      lj_wbuf_addbyte(out,'\0');
      lj_symtab_dump_proto(out,(GCproto *)trace);
    }
    uVar1 = (trace->nextgc).gcptr32;
  }
  dl_iterate_phdr(resolve_symbolnames,&local_38);
  lj_wbuf_addbyte(out,0x80);
  return;
}

Assistant:

void lj_symtab_dump(struct lj_wbuf *out, const struct global_State *g,
		    uint32_t *lib_adds)
{
  const GCRef *iter = &g->gc.root;
  const GCobj *o;
  const size_t ljs_header_len = sizeof(ljs_header) / sizeof(ljs_header[0]);

#if LJ_HASRESOLVER
  struct symbol_resolver_conf conf = {
    .buf = out,
    .L = gco2th(gcref(g->cur_L)),
    .header = SYMTAB_CFUNC,
    .cur_lib = 0,
    .to_dump_cnt = 0,
    .lib_adds = lib_adds
  };
#else
  UNUSED(lib_adds);
#endif

  /* Write prologue. */
  lj_wbuf_addn(out, ljs_header, ljs_header_len);

  while ((o = gcref(*iter)) != NULL) {
    switch (o->gch.gct) {
    case (~LJ_TPROTO): {
      const GCproto *pt = gco2pt(o);
      lj_wbuf_addbyte(out, SYMTAB_LFUNC);
      lj_symtab_dump_proto(out, pt);
      break;
    }
#if LJ_HASJIT
    case (~LJ_TTRACE): {
      lj_wbuf_addbyte(out, SYMTAB_TRACE);
      lj_symtab_dump_trace(out, gco2trace(o));
      break;
    }
#endif /* LJ_HASJIT */
    default:
      break;
    }
    iter = &o->gch.nextgc;
  }

#if LJ_HASRESOLVER
  /* Write C symbols. */
  dl_iterate_phdr(resolve_symbolnames, &conf);
#endif
  lj_wbuf_addbyte(out, SYMTAB_FINAL);
}